

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizer.cpp
# Opt level: O1

Action __thiscall
psy::C::TypeCanonicalizer::visitTranslationUnit(TypeCanonicalizer *this,TranslationUnitSyntax *node)

{
  Action AVar1;
  DeclarationListSyntax *pDVar2;
  TranslationUnitSymbol *local_20;
  
  local_20 = SemanticModel::translationUnit(this->semaModel_);
  std::deque<psy::C::Symbol_const*,std::allocator<psy::C::Symbol_const*>>::
  emplace_back<psy::C::Symbol_const*>
            ((deque<psy::C::Symbol_const*,std::allocator<psy::C::Symbol_const*>> *)&this->syms_,
             (Symbol **)&local_20);
  pDVar2 = node->decls_;
  while( true ) {
    if (pDVar2 == (DeclarationListSyntax *)0x0) {
      std::deque<const_psy::C::Symbol_*,_std::allocator<const_psy::C::Symbol_*>_>::pop_back
                (&(this->syms_).c);
      return Skip;
    }
    AVar1 = SyntaxVisitor::visit
                      (&this->super_SyntaxVisitor,
                       &((pDVar2->
                         super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
                         ).
                         super_List<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
                        .value)->super_SyntaxNode);
    if (AVar1 == Quit) break;
    pDVar2 = (pDVar2->
             super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
             ).
             super_List<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
             .next;
  }
  return Quit;
}

Assistant:

SyntaxVisitor::Action TypeCanonicalizer::visitTranslationUnit(const TranslationUnitSyntax* node)
{
    syms_.push(semaModel_->translationUnit());
    VISIT(node->declarations());
    syms_.pop();

    return Action::Skip;
}